

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-file_reading.c
# Opt level: O0

greatest_test_res fr_stop_times(void)

{
  int iVar1;
  undefined1 local_1a68 [8];
  stop_time_t expected [28];
  stop_time_t *psStack_20;
  int record_count;
  stop_time_t *records;
  FILE *fp;
  
  records = (stop_time_t *)fopen("../tests/data/google_sample/stop_times.txt","r");
  if (records == (stop_time_t *)0x0) {
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_reading.c"
    ;
    greatest_info.fail_line = 0x197;
    greatest_info.msg = "Couldn\'t open `data/google_sample/stop_times.txt` test file";
    if ((greatest_info.flags & 4) != 0) {
      abort();
    }
    fp._4_4_ = GREATEST_TEST_RES_FAIL;
  }
  else {
    expected[0x1b]._236_4_ = read_all_stop_times((FILE *)records,&stack0xffffffffffffffe0);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (expected[0x1b]._236_4_ == 0x1c) {
      memcpy(local_1a68,&DAT_002457a0,0x1a40);
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = equal_stop_time((stop_time_t *)local_1a68,psStack_20);
      if (iVar1 == 0) {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_reading.c"
        ;
        greatest_info.fail_line = 0x1c5;
        greatest_info.msg = "equal_stop_time(&(expected[0]), &(records[0]))";
        if ((greatest_info.flags & 4) != 0) {
          abort();
        }
        fp._4_4_ = GREATEST_TEST_RES_FAIL;
      }
      else {
        greatest_info.assertions = greatest_info.assertions + 1;
        iVar1 = equal_stop_time((stop_time_t *)&expected[0].timepoint,psStack_20 + 1);
        if (iVar1 == 0) {
          greatest_info.fail_file =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_reading.c"
          ;
          greatest_info.fail_line = 0x1c6;
          greatest_info.msg = "equal_stop_time(&(expected[1]), &(records[1]))";
          if ((greatest_info.flags & 4) != 0) {
            abort();
          }
          fp._4_4_ = GREATEST_TEST_RES_FAIL;
        }
        else {
          greatest_info.assertions = greatest_info.assertions + 1;
          iVar1 = equal_stop_time((stop_time_t *)&expected[1].timepoint,psStack_20 + 2);
          if (iVar1 == 0) {
            greatest_info.fail_file =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_reading.c"
            ;
            greatest_info.fail_line = 0x1c7;
            greatest_info.msg = "equal_stop_time(&(expected[2]), &(records[2]))";
            if ((greatest_info.flags & 4) != 0) {
              abort();
            }
            fp._4_4_ = GREATEST_TEST_RES_FAIL;
          }
          else {
            if (0 < (int)expected[0x1b]._236_4_) {
              free(psStack_20);
            }
            if (records != (stop_time_t *)0x0) {
              fclose((FILE *)records);
            }
            greatest_info.msg = (char *)0x0;
            fp._4_4_ = GREATEST_TEST_RES_PASS;
          }
        }
      }
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_reading.c"
      ;
      greatest_info.fail_line = 0x19c;
      greatest_info.msg = "28 != record_count";
      if ((greatest_info.flags & 4) != 0) {
        abort();
      }
      fp._4_4_ = GREATEST_TEST_RES_FAIL;
    }
  }
  return fp._4_4_;
}

Assistant:

TEST fr_stop_times(void) {
    FILE *fp = fopen("../tests/data/google_sample/stop_times.txt", "r");
    if (fp == NULL) {
        FAILm("Couldn't open `data/google_sample/stop_times.txt` test file");
    } else {
        stop_time_t *records;
        int record_count = read_all_stop_times(fp, &records);

        ASSERT_EQ(28, record_count);

        stop_time_t expected[28] = {
            {
                .trip_id = "STBA",
                .arrival_time = "6:00:00",
                .departure_time = "6:00:00",
                .stop_id = "STAGECOACH",
                .stop_sequence = 1,
                .stop_headsign = "",
                .pickup_type = ST_REGULAR,
                .dropoff_type = ST_REGULAR,
                .shape_dist_traveled = 0,
                .timepoint = TP_EXACT
            },
            {
                .trip_id = "STBA",
                .arrival_time = "6:20:00",
                .departure_time = "6:20:00",
                .stop_id = "BEATTY_AIRPORT",
                .stop_sequence = 2,
                .stop_headsign = "",
                .pickup_type = ST_REGULAR,
                .dropoff_type = ST_REGULAR,
                .shape_dist_traveled = 0,
                .timepoint = TP_EXACT
            },
            {
                .trip_id = "CITY1",
                .arrival_time = "6:00:00",
                .departure_time = "6:00:00",
                .stop_id = "STAGECOACH",
                .stop_sequence = 1,
                .stop_headsign = "",
                .pickup_type = ST_REGULAR,
                .dropoff_type = ST_REGULAR,
                .shape_dist_traveled = 0,
                .timepoint = TP_EXACT
            }
        };

        ASSERT(equal_stop_time(&(expected[0]), &(records[0])));
        ASSERT(equal_stop_time(&(expected[1]), &(records[1])));
        ASSERT(equal_stop_time(&(expected[2]), &(records[2])));

        if (record_count > 0) free(records);
        if (fp) fclose(fp);
    }
    PASS();
}